

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O1

void __thiscall gui::Panel::Panel(Panel *this,shared_ptr<gui::PanelStyle> *style,String *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  Group::Group(&this->super_Group,name);
  (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
       (_func_int **)&PTR__Panel_001e7c10;
  (this->super_Group).super_Container.super_Widget.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__Panel_001e7c90;
  (this->style_).super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (style->super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->style_).super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->styleCopied_ = false;
  (this->size_).x = 0.0;
  (this->size_).y = 0.0;
  return;
}

Assistant:

Panel::Panel(std::shared_ptr<PanelStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false) {
}